

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_>::truncate
          (ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_> *this,char *__file,__off_t __length)

{
  Own<capnp::_::SegmentBuilder> *pOVar1;
  Own<capnp::_::SegmentBuilder> *pOVar2;
  SegmentBuilder *pSVar3;
  __off_t extraout_RDX;
  
  pOVar1 = this->ptr;
  pOVar2 = this->pos;
  while (pOVar1 + (long)__file < pOVar2) {
    this->pos = pOVar2 + -1;
    pSVar3 = pOVar2[-1].ptr;
    if (pSVar3 != (SegmentBuilder *)0x0) {
      pOVar2[-1].ptr = (SegmentBuilder *)0x0;
      (*(code *)**(undefined8 **)pOVar2[-1].disposer)(pOVar2[-1].disposer,pSVar3,__length);
      __length = extraout_RDX;
    }
    pOVar2 = this->pos;
  }
  return (int)pOVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }